

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAS.cpp
# Opt level: O2

Pulse __thiscall Storage::Tape::CAS::virtual_get_next_pulse(CAS *this)

{
  pointer pCVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Phase PVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  Pulse PVar10;
  
  uVar6 = 0x258000000000;
  uVar8 = 2;
  switch(this->phase_) {
  case Header:
    uVar6 = 0x100000000;
    sVar7 = this->distance_into_bit_ + 1;
    this->distance_into_bit_ = sVar7;
    if (sVar7 == 2) {
      sVar7 = this->distance_into_phase_ + 1;
      this->distance_into_phase_ = sVar7;
      this->distance_into_bit_ = 0;
      sVar9 = 0x1f00;
      if ((this->chunks_).
          super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>.
          _M_impl.super__Vector_impl_data._M_start[this->chunk_pointer_].long_header != false) {
        sVar9 = 0x7c00;
      }
      if (sVar7 == sVar9) {
        this->phase_ = Bytes;
        this->distance_into_phase_ = 0;
        this->distance_into_bit_ = 0;
      }
      sVar7 = 0;
    }
    break;
  case Bytes:
    pCVar1 = (this->chunks_).
             super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = this->chunk_pointer_;
    uVar8 = this->distance_into_phase_;
    lVar2 = *(long *)&pCVar1[sVar9].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    uVar4 = SUB164(auVar3 % ZEXT816(0xb),0);
    if (uVar4 - 9 < 2) {
      uVar4 = 1;
    }
    else if (uVar4 != 0) {
      uVar4 = *(byte *)(lVar2 + uVar8 / 0xb) >> (SUB161(auVar3 % ZEXT816(0xb),0) - 1U & 0x1f) & 1;
    }
    sVar7 = this->distance_into_bit_ + 1;
    this->distance_into_bit_ = sVar7;
    if (sVar7 == (ulong)(uVar4 != 0) * 2 + 2) {
      this->distance_into_bit_ = 0;
      this->distance_into_phase_ = uVar8 + 1;
      if (uVar8 + 1 ==
          ((long)*(pointer *)
                  ((long)&pCVar1[sVar9].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 8) - lVar2) * 0xb) {
        this->distance_into_phase_ = 0;
        sVar9 = sVar9 + 1;
        this->chunk_pointer_ = sVar9;
        if (sVar9 == (long)(this->chunks_).
                           super__Vector_base<Storage::Tape::CAS::Chunk,_std::allocator<Storage::Tape::CAS::Chunk>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 5) {
          PVar5 = EndOfFile;
        }
        else {
          PVar5 = (uint)pCVar1[sVar9].has_gap * 2;
        }
        this->phase_ = PVar5;
      }
      sVar7 = 0;
    }
    uVar6 = (ulong)(2 - uVar4) << 0x20;
    break;
  case Gap:
    this->phase_ = Header;
    this->distance_into_phase_ = 0;
  case EndOfFile:
    goto switchD_003eb58e_caseD_3;
  default:
    uVar6 = 0x100000000;
    sVar7 = this->distance_into_bit_;
  }
  uVar8 = (ulong)(~(uint)sVar7 & 1);
switchD_003eb58e_caseD_3:
  PVar10._0_8_ = uVar6 | uVar8;
  PVar10.length.clock_rate = 0x2580;
  return PVar10;
}

Assistant:

Tape::Pulse CAS::virtual_get_next_pulse() {
	Pulse pulse;
	pulse.length.clock_rate = 9600;
	// Clock rate is four times the baud rate (of 2400), because the quickest thing that might need
	// to be communicated is a '1', which is two cycles at the baud rate, i.e. four events:
	// high, low, high, low.

	// If this is a gap, then that terminates a file. If this is already the end
	// of the file then perpetual gaps await.
	if(phase_ == Phase::Gap || phase_ == Phase::EndOfFile) {
		pulse.length.length = pulse.length.clock_rate;
		pulse.type = Pulse::Type::Zero;

		if(phase_ == Phase::Gap) {
			phase_ = Phase::Header;
			distance_into_phase_ = 0;
		}

		return pulse;
	}

	// Determine which bit is now forthcoming.
	int bit = 1;

	switch(phase_) {
		default: break;

		case Phase::Header: {
			// In the header, all bits are 1s, so let the default value stand. Just check whether the
			// header is ended and, if so, move on to bytes.
			distance_into_bit_++;
			if(distance_into_bit_ == 2) {
				distance_into_phase_++;
				distance_into_bit_ = 0;

				// This code always produces a 2400 baud signal; so use the appropriate Red Book-supplied
				// constants to check whether the header has come to an end.
				if(distance_into_phase_ == (chunks_[chunk_pointer_].long_header ? 31744 : 7936)) {
					phase_ = Phase::Bytes;
					distance_into_phase_ = 0;
					distance_into_bit_ = 0;
				}
			}
		} break;

		case Phase::Bytes: {
			// Provide bits with a single '0' start bit and two '1' stop bits.
			uint8_t byte_value = chunks_[chunk_pointer_].data[distance_into_phase_ / 11];
			int bit_offset = distance_into_phase_ % 11;
			switch(bit_offset) {
				case 0:		bit = 0;									break;
				default:	bit = (byte_value >> (bit_offset - 1)) & 1;	break;
				case 9:
				case 10:	bit = 1;									break;
			}

			// If bit is finished, and if all bytes in chunk have been posted then:
			//	- if this is the final chunk then note end of file.
			//	- otherwise, roll onto the next header or gap, depending on whether the next chunk has a gap.
			distance_into_bit_++;
			if(distance_into_bit_ == (bit ? 4 : 2)) {
				distance_into_bit_ = 0;
				distance_into_phase_++;
				if(distance_into_phase_ == chunks_[chunk_pointer_].data.size() * 11) {
					distance_into_phase_ = 0;
					chunk_pointer_++;
					if(chunk_pointer_ == chunks_.size()) {
						phase_ = Phase::EndOfFile;
					} else {
						phase_ = chunks_[chunk_pointer_].has_gap ? Phase::Gap : Phase::Header;
					}
				}
			}
		} break;
	}

	// A '1' is encoded with twice the frequency of a '0'.
	pulse.length.length = unsigned(2 - bit);
	pulse.type = (distance_into_bit_ & 1) ? Pulse::Type::High : Pulse::Type::Low;

	return pulse;
}